

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::TestCase
          (DataTest *this,offset_in_DataTest_to_subr UploadDataFunction,GLenum parameter)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  GLuint *data_00;
  uint in_ECX;
  long *plVar5;
  undefined4 in_register_00000014;
  code *local_a8;
  GLuint *data;
  int local_44;
  bool is_error;
  bool is_ok;
  long lStack_40;
  GLuint buffer;
  Functions *gl;
  code *pcStack_30;
  GLenum parameter_local;
  offset_in_DataTest_to_subr UploadDataFunction_local;
  DataTest *local_20;
  DataTest *this_local;
  offset_in_DataTest_to_subr local_10;
  
  UploadDataFunction_local = CONCAT44(in_register_00000014,parameter);
  gl._4_4_ = in_ECX;
  pcStack_30 = (code *)UploadDataFunction;
  local_20 = this;
  this_local = (DataTest *)UploadDataFunction;
  local_10 = UploadDataFunction_local;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_40 = CONCAT44(extraout_var,iVar2);
  local_44 = 0;
  (**(code **)(lStack_40 + 0x3b8))(1,&local_44);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x146);
  plVar5 = (long *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode +
                   UploadDataFunction_local);
  if (((ulong)pcStack_30 & 1) == 0) {
    local_a8 = pcStack_30;
  }
  else {
    local_a8 = *(code **)(pcStack_30 + *plVar5 + -1);
  }
  (*local_a8)(plVar5,local_44,gl._4_4_);
  (**(code **)(lStack_40 + 0x40))(0x8892,local_44);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x14b);
  data_00 = (GLuint *)(**(code **)(lStack_40 + 0xcf8))(0x8892,35000);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"glMapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x14e);
  bVar1 = compare(this,data_00,(GLuint *)s_reference,0xd);
  if (!bVar1) {
    LogFail(this,(offset_in_DataTest_to_subr)pcStack_30,(GLenum)UploadDataFunction_local,
            (GLuint *)(ulong)gl._4_4_,data_00,0x2a780c0);
  }
  (**(code **)(lStack_40 + 0x1670))(0x8892);
  dVar3 = (**(code **)(lStack_40 + 0x800))();
  glu::checkError(dVar3,"glUnmapBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x158);
  if (local_44 != 0) {
    (**(code **)(lStack_40 + 0x438))(1,&local_44);
    dVar3 = (**(code **)(lStack_40 + 0x800))();
    glu::checkError(dVar3,"glDeleteBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x165);
  }
  return bVar1;
}

Assistant:

bool DataTest::TestCase(void (DataTest::*UploadDataFunction)(glw::GLuint, glw::GLenum), glw::GLenum parameter)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint buffer   = 0;
	bool		is_ok	= true;
	bool		is_error = false;

	try
	{
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		(this->*UploadDataFunction)(buffer, parameter);

		gl.bindBuffer(GL_ARRAY_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer failed.");

		glw::GLuint* data = (glw::GLuint*)gl.mapBuffer(GL_ARRAY_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer failed.");

		is_ok = compare(data, s_reference, s_reference_count);

		if (!is_ok)
		{
			LogFail(UploadDataFunction, parameter, data, s_reference, s_reference_count);
		}

		gl.unmapBuffer(GL_ARRAY_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer failed.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		LogError(UploadDataFunction, parameter);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers failed.");
	}

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}